

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O2

void __thiscall
MeshDenoisingBase::getFaceArea
          (MeshDenoisingBase *this,TriMesh *mesh,vector<double,_std::allocator<double>_> *area)

{
  double *pdVar1;
  value_type _vh;
  size_type __new_size;
  Point *pPVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  FaceIter FVar11;
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  local_90;
  undefined1 local_78 [8];
  FaceVertexIter fv_it;
  undefined1 auStack_58 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> point;
  FaceIter f_it;
  
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ = area;
  std::vector<double,_std::allocator<double>_>::resize(area,__new_size);
  join_0x00000010_0x00000000_ = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  while( true ) {
    FVar11 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    if (((mesh_ptr)
         point.
         super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage == FVar11.mesh_) &&
       (f_it.mesh_._0_4_ == (BaseHandle)FVar11.hnd_.super_BaseHandle.idx_)) break;
    auStack_58 = (undefined1  [8])0x0;
    point.
    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    point.
    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
    resize((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)
           auStack_58,3);
    OpenMesh::PolyConnectivity::fv_iter
              ((FaceVertexIter *)local_78,(PolyConnectivity *)mesh,(FaceHandle)f_it.mesh_._0_4_);
    lVar3 = 0;
    while ((fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
           (((int)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
             fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
            (fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
             idx_ == 0))))) {
      _vh = OpenMesh::Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::operator*((FaceVertexIter *)local_78);
      pPVar2 = OpenMesh::
               AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
               point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      *)mesh,(VertexHandle)_vh.super_BaseHandle.idx_);
      *(double *)((long)((VectorDataT<double,_3> *)auStack_58)->values_ + lVar3 + 0x10) =
           (pPVar2->super_VectorDataT<double,_3>).values_[2];
      dVar5 = (pPVar2->super_VectorDataT<double,_3>).values_[1];
      pdVar1 = (double *)((long)((VectorDataT<double,_3> *)auStack_58)->values_ + lVar3);
      *pdVar1 = (pPVar2->super_VectorDataT<double,_3>).values_[0];
      pdVar1[1] = dVar5;
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator++(&local_90,(FaceVertexIter *)local_78,0);
      lVar3 = lVar3 + 0x18;
    }
    dVar5 = (((pointer)((long)auStack_58 + 0x18))->super_VectorDataT<double,_3>).values_[0];
    dVar7 = dVar5 - ((VectorDataT<double,_3> *)auStack_58)->values_[0];
    dVar4 = (((pointer)((long)auStack_58 + 0x18))->super_VectorDataT<double,_3>).values_[1];
    dVar8 = dVar4 - ((VectorDataT<double,_3> *)auStack_58)->values_[1];
    dVar10 = (((pointer)((long)auStack_58 + 0x18))->super_VectorDataT<double,_3>).values_[2];
    dVar6 = dVar10 - ((VectorDataT<double,_3> *)auStack_58)->values_[2];
    dVar5 = dVar5 - (((pointer)((long)auStack_58 + 0x30))->super_VectorDataT<double,_3>).values_[0];
    dVar4 = dVar4 - (((pointer)((long)auStack_58 + 0x30))->super_VectorDataT<double,_3>).values_[1];
    dVar10 = dVar10 - (((pointer)((long)auStack_58 + 0x30))->super_VectorDataT<double,_3>).values_
                      [2];
    dVar9 = dVar8 * dVar10 - dVar4 * dVar6;
    dVar10 = dVar6 * dVar5 - dVar10 * dVar7;
    dVar5 = dVar4 * dVar7 - dVar5 * dVar8;
    *(double *)
     (*(long *)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ +
     (long)(int)f_it.mesh_._0_4_ * 8) = SQRT(dVar5 * dVar5 + dVar9 * dVar9 + dVar10 * dVar10) * 0.5;
    std::_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     *)auStack_58);
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)&point.
                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  }
  return;
}

Assistant:

void MeshDenoisingBase::getFaceArea(TriMesh &mesh, std::vector<double> &area)
{
    area.resize(mesh.n_faces());

    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        std::vector<TriMesh::Point> point;
        point.resize(3); int index = 0;
        for(TriMesh::FaceVertexIter fv_it = mesh.fv_iter(*f_it); fv_it.is_valid(); fv_it++)
        {
            point[index] = mesh.point(*fv_it);
            index++;
        }
        TriMesh::Point edge1 = point[1] - point[0];
        TriMesh::Point edge2 = point[1] - point[2];
        double S = 0.5 * (edge1 % edge2).length();
        area[(*f_it).idx()] = S;
    }
}